

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

void __thiscall libtorrent::upnp::on_expire(upnp *this,error_code *ec)

{
  bool bVar1;
  value_type *pvVar2;
  undefined1 local_c8 [64];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_88;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68;
  int local_5c;
  strong_typedef<int,_libtorrent::port_mapping_tag,_void> local_58;
  strong_typedef<int,_libtorrent::port_mapping_tag,_void> local_54;
  resolver_interface rStack_50;
  port_mapping_t m;
  rootdevice *d;
  rootdevice *dev;
  iterator __end1;
  iterator __begin1;
  set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
  *__range1;
  time_point next_expire;
  time_point now;
  error_code *ec_local;
  upnp *this_local;
  
  bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
  if ((!bVar1) && ((this->m_closing & 1U) == 0)) {
    next_expire = libtorrent::aux::time_now();
    __range1 = (set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
                *)max_time();
    __end1 = ::std::
             set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
             ::begin(&this->m_devices);
    dev = (rootdevice *)
          ::std::
          set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
          ::end(&this->m_devices);
    while (bVar1 = ::std::operator!=(&__end1,(_Self *)&dev), bVar1) {
      rStack_50._vptr_resolver_interface =
           (_func_int **)
           ::std::_Rb_tree_const_iterator<libtorrent::upnp::rootdevice>::operator*(&__end1);
      if ((((reference)rStack_50._vptr_resolver_interface)->disabled & 1U) == 0) {
        memset(&local_54,0,4);
        while( true ) {
          local_58 = libtorrent::aux::
                     container_wrapper<libtorrent::upnp::global_mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
                     ::end_index(&this->m_mappings);
          bVar1 = libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::
                  operator<(&local_54,&local_58);
          if (!bVar1) break;
          local_5c = local_54.m_val;
          pvVar2 = libtorrent::aux::
                   container_wrapper<libtorrent::upnp::mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
                   ::operator[]((vector<mapping_t,_port_mapping_t>_conflict *)
                                (rStack_50._vptr_resolver_interface + 0xc),local_54);
          local_68.__d.__r = (duration)max_time();
          bVar1 = ::std::chrono::operator==
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)pvVar2,&local_68);
          if (!bVar1) {
            local_6c = local_54.m_val;
            pvVar2 = libtorrent::aux::
                     container_wrapper<libtorrent::upnp::mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
                     ::operator[]((vector<mapping_t,_port_mapping_t>_conflict *)
                                  (rStack_50._vptr_resolver_interface + 0xc),local_54);
            bVar1 = ::std::chrono::operator<=
                              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)pvVar2,&next_expire);
            if (bVar1) {
              local_70 = local_54.m_val;
              pvVar2 = libtorrent::aux::
                       container_wrapper<libtorrent::upnp::mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
                       ::operator[]((vector<mapping_t,_port_mapping_t>_conflict *)
                                    (rStack_50._vptr_resolver_interface + 0xc),local_54);
              (pvVar2->super_base_mapping).act = add;
              local_74 = local_54.m_val;
              update_map(this,(rootdevice *)rStack_50._vptr_resolver_interface,
                         (port_mapping_t)local_54.m_val);
            }
            local_78 = local_54.m_val;
            pvVar2 = libtorrent::aux::
                     container_wrapper<libtorrent::upnp::mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
                     ::operator[]((vector<mapping_t,_port_mapping_t>_conflict *)
                                  (rStack_50._vptr_resolver_interface + 0xc),local_54);
            bVar1 = ::std::chrono::operator<
                              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)pvVar2,
                               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&__range1);
            if (bVar1) {
              local_7c = local_54.m_val;
              pvVar2 = libtorrent::aux::
                       container_wrapper<libtorrent::upnp::mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
                       ::operator[]((vector<mapping_t,_port_mapping_t>_conflict *)
                                    (rStack_50._vptr_resolver_interface + 0xc),local_54);
              __range1 = (set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
                          *)(pvVar2->super_base_mapping).expires.__d.__r;
            }
          }
          libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::operator++
                    (&local_54);
        }
      }
      ::std::_Rb_tree_const_iterator<libtorrent::upnp::rootdevice>::operator++(&__end1);
    }
    local_88.__d.__r = (duration)max_time();
    bVar1 = ::std::chrono::operator!=
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&__range1,&local_88);
    if (bVar1) {
      boost::asio::
      basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::expires_at(&this->m_refresh_timer,(time_point *)&__range1);
      local_c8._16_8_ = on_expire;
      local_c8._24_8_ = (pointer)0x0;
      self((upnp *)local_c8);
      ::std::
      bind<void(libtorrent::upnp::*)(boost::system::error_code_const&),std::shared_ptr<libtorrent::upnp>,std::_Placeholder<1>const&>
                ((type *)(local_c8 + 0x20),(offset_in_upnp_to_subr *)(local_c8 + 0x10),
                 (shared_ptr<libtorrent::upnp> *)local_c8,
                 (_Placeholder<1> *)&::std::placeholders::_1);
      boost::asio::
      basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
      ::
      async_wait<std::_Bind<void(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                  *)&this->m_refresh_timer,
                 (_Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                  *)(local_c8 + 0x20));
      ::std::
      _Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
      ::~_Bind((_Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                *)(local_c8 + 0x20));
      ::std::shared_ptr<libtorrent::upnp>::~shared_ptr((shared_ptr<libtorrent::upnp> *)local_c8);
    }
  }
  return;
}

Assistant:

void upnp::on_expire(error_code const& ec)
{
	TORRENT_ASSERT(is_single_thread());
	COMPLETE_ASYNC("upnp::on_expire");
	if (ec) return;

	if (m_closing) return;

	time_point const now = aux::time_now();
	time_point next_expire = max_time();

	for (auto const& dev : m_devices)
	{
		auto& d = const_cast<rootdevice&>(dev);
		TORRENT_ASSERT(d.magic == 1337);
		if (d.disabled) continue;
		for (port_mapping_t m{0}; m < m_mappings.end_index(); ++m)
		{
			if (d.mapping[m].expires == max_time())
				continue;

			if (d.mapping[m].expires <= now)
			{
				d.mapping[m].act = portmap_action::add;
				update_map(d, m);
			}
			if (d.mapping[m].expires < next_expire)
			{
				next_expire = d.mapping[m].expires;
			}
		}
	}
	if (next_expire != max_time())
	{
		ADD_OUTSTANDING_ASYNC("upnp::on_expire");
		m_refresh_timer.expires_at(next_expire);
		m_refresh_timer.async_wait(std::bind(&upnp::on_expire, self(), _1));
	}
}